

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb-c.cpp
# Opt level: O3

duckdb_state
duckdb_get_or_create_from_cache
          (duckdb_instance_cache instance_cache,char *path,duckdb_database *out_database,
          duckdb_config config,char **out_error)

{
  duckdb_state dVar1;
  char *pcVar2;
  
  if (instance_cache != (duckdb_instance_cache)0x0) {
    dVar1 = duckdb_open_internal
                      ((DBInstanceCacheWrapper *)instance_cache,path,out_database,config,out_error);
    return dVar1;
  }
  if (out_error != (char **)0x0) {
    pcVar2 = strdup("instance cache cannot be nullptr");
    *out_error = pcVar2;
  }
  return DuckDBError;
}

Assistant:

duckdb_state duckdb_get_or_create_from_cache(duckdb_instance_cache instance_cache, const char *path,
                                             duckdb_database *out_database, duckdb_config config, char **out_error) {
	if (!instance_cache) {
		if (out_error) {
			*out_error = strdup("instance cache cannot be nullptr");
		}
		return DuckDBError;
	}
	auto cache = reinterpret_cast<DBInstanceCacheWrapper *>(instance_cache);
	return duckdb_open_internal(cache, path, out_database, config, out_error);
}